

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::
ParserTest_RegressionNestedOpenBraceDoNotStackOverflow_Test::
~ParserTest_RegressionNestedOpenBraceDoNotStackOverflow_Test
          (ParserTest_RegressionNestedOpenBraceDoNotStackOverflow_Test *this)

{
  ParserTest::~ParserTest(&this->super_ParserTest);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParserTest, RegressionNestedOpenBraceDoNotStackOverflow) {
  std::string input("edition=\"a\000;", 12);
  input += std::string(100000, '{');
  ExpectHasEarlyExitErrors(
      input,
      "0:10: Unexpected end of string.\n"
      "0:10: Invalid control characters encountered in text.\n"
      "0:8: Unknown edition \"a\".\n");
}